

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  stbi_uc *psVar4;
  int iVar5;
  undefined1 local_4890 [8];
  stbi__jpeg j;
  
  local_4890 = (undefined1  [8])s;
  iVar1 = stbi__decode_jpeg_header((stbi__jpeg *)local_4890,2);
  if (iVar1 == 0) {
    *(stbi_uc **)((long)local_4890 + 0xb8) = *(stbi_uc **)((long)local_4890 + 200);
  }
  else {
    if (x != (int *)0x0) {
      *x = *(stbi__uint32 *)local_4890;
    }
    if (y != (int *)0x0) {
      *y = *(stbi__uint32 *)((long)local_4890 + 4);
    }
    if (comp != (int *)0x0) {
      *comp = *(int *)((long)local_4890 + 8);
    }
  }
  iVar5 = 1;
  if (iVar1 != 0) {
    return 1;
  }
  local_4890 = (undefined1  [8])s;
  iVar1 = stbi__parse_png_file((stbi__png *)local_4890,2,0);
  if (iVar1 == 0) {
    *(stbi_uc **)((long)local_4890 + 0xb8) = *(stbi_uc **)((long)local_4890 + 200);
  }
  else {
    if (x != (int *)0x0) {
      *x = *(stbi__uint32 *)local_4890;
    }
    if (y != (int *)0x0) {
      *y = *(stbi__uint32 *)((long)local_4890 + 4);
    }
    if (comp != (int *)0x0) {
      *comp = *(int *)((long)local_4890 + 8);
    }
  }
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = stbi__gif_header(s,(stbi__gif *)local_4890,comp,1);
  if (iVar1 == 0) {
    s->img_buffer = s->img_buffer_original;
  }
  else {
    if (x != (int *)0x0) {
      *x = local_4890._0_4_;
    }
    if (y != (int *)0x0) {
      *y = local_4890._4_4_;
    }
  }
  if (iVar1 != 0) {
    return 1;
  }
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_0011878c;
    psVar4 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar1;
    }
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'B') goto LAB_0011878c;
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_0011878c;
    psVar4 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar4;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar4;
      s->img_buffer_end = psVar4 + iVar1;
    }
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'M') goto LAB_0011878c;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001186ef:
    s->img_buffer = s->img_buffer + 0xc;
  }
  else {
    iVar1 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (0xb < iVar1) goto LAB_001186ef;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0xc - iVar1);
  }
  iVar2 = stbi__get16le(s);
  iVar1 = stbi__get16le(s);
  iVar2 = iVar1 * 0x10000 + iVar2;
  if (iVar2 < 0x38) {
    if (iVar2 != 0xc) {
      if (iVar2 != 0x28) goto LAB_0011878c;
      goto LAB_00118734;
    }
    iVar1 = stbi__get16le(s);
    *x = iVar1;
    iVar1 = stbi__get16le(s);
  }
  else {
    if (((iVar2 != 0x38) && (iVar2 != 0x6c)) && (iVar2 != 0x7c)) goto LAB_0011878c;
LAB_00118734:
    iVar1 = stbi__get16le(s);
    iVar2 = stbi__get16le(s);
    *x = iVar2 * 0x10000 + iVar1;
    iVar1 = stbi__get16le(s);
    iVar2 = stbi__get16le(s);
    iVar1 = iVar2 * 0x10000 + iVar1;
  }
  *y = iVar1;
  iVar1 = stbi__get16le(s);
  if (iVar1 == 1) {
    uVar3 = stbi__get16le(s);
    *comp = uVar3 >> 3;
    return 1;
  }
LAB_0011878c:
  s->img_buffer = s->img_buffer_original;
  iVar1 = stbi__psd_info(s,x,y,comp);
  if (((iVar1 == 0) && (iVar1 = stbi__pic_info(s,x,y,comp), iVar1 == 0)) &&
     ((iVar1 = stbi__pnm_info(s,x,y,comp), iVar1 == 0 &&
      ((iVar1 = stbi__hdr_info(s,x,y,comp), iVar1 == 0 &&
       (iVar1 = stbi__tga_info(s,x,y,comp), iVar1 == 0)))))) {
    stbi__g_failure_reason = "unknown image type";
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}